

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::_internal_add_normalizedshape
          (LayerNormalizationLayerParams *this,int64_t value)

{
  int64_t local_18;
  int64_t value_local;
  LayerNormalizationLayerParams *this_local;
  
  local_18 = value;
  value_local = (int64_t)this;
  google::protobuf::RepeatedField<long>::Add(&this->normalizedshape_,&local_18);
  return;
}

Assistant:

inline void LayerNormalizationLayerParams::_internal_add_normalizedshape(int64_t value) {
  normalizedshape_.Add(value);
}